

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

boolean_format_info * __thiscall
toml::basic_value<toml::type_config>::as_boolean_fmt(basic_value<toml::type_config> *this)

{
  char *in_RDI;
  value_t in_stack_000000c7;
  string *in_stack_000000c8;
  basic_value<toml::type_config> *in_stack_000000d0;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  if (*in_RDI != '\x01') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    throw_bad_cast(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7);
  }
  return (boolean_format_info *)(in_RDI + 9);
}

Assistant:

boolean_format_info const& as_boolean_fmt() const
    {
        if(this->type_ != value_t::boolean)
        {
            this->throw_bad_cast("toml::value::as_boolean_fmt()", value_t::boolean);
        }
        return this->boolean_.format;
    }